

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

_Bool floor_carry(chunk *c,loc grid,object *drop,_Bool *note)

{
  _Bool _Var1;
  object *poVar2;
  object *obj1;
  loc lVar3;
  chunk *p_c;
  uint uVar4;
  object *ignore;
  
  poVar2 = floor_get_oldest_ignored(player,c,grid);
  ignore = poVar2;
  _Var1 = square_isobjectholding((chunk_conflict *)c,grid);
  uVar4 = 0;
  if (_Var1) {
    for (obj1 = square_object((chunk_conflict *)c,grid); obj1 != (object *)0x0; obj1 = obj1->next) {
      _Var1 = object_mergeable(obj1,drop,OSTACK_FLOOR);
      if (_Var1) {
        object_absorb(obj1,drop);
        _Var1 = square_isview((chunk_conflict *)c,grid);
        if (_Var1) {
          square_note_spot(c,grid);
        }
        goto LAB_0018a94d;
      }
      uVar4 = uVar4 + 1;
    }
    if ((z_info->floor_size <= uVar4) || (uVar4 != 0 && (player->opts).opt[0x23] == false)) {
      if (poVar2 == (object *)0x0) {
        uVar4 = 0;
        goto LAB_0018a964;
      }
      if ((chunk *)cave == c) {
        p_c = (chunk *)player->cave;
      }
      else {
        p_c = (chunk *)0x0;
      }
      square_excise_object((chunk_conflict *)c,grid,poVar2);
      delist_object((chunk_conflict *)c,poVar2);
      object_delete(c,p_c,&ignore);
    }
    (drop->grid).x = grid.x;
    (drop->grid).y = grid.y;
    drop->held_m_idx = 0;
    pile_insert(&c->squares[(long)grid >> 0x20][grid.x].obj,drop);
    list_object((chunk_conflict *)c,drop);
    poVar2 = drop->known;
    if (poVar2 != (object *)0x0) {
      poVar2->oidx = drop->oidx;
      poVar2->held_m_idx = 0;
      lVar3 = (loc)loc(0,0);
      poVar2->grid = lVar3;
      player->cave->objects[drop->oidx] = drop->known;
    }
    square_note_spot(c,grid);
    square_light_spot(c,grid);
    obj1 = drop;
LAB_0018a94d:
    _Var1 = ignore_item_ok(player,obj1);
    uVar4 = 1;
    if (_Var1) {
      *note = false;
      uVar4 = 1;
    }
  }
LAB_0018a964:
  return SUB41(uVar4,0);
}

Assistant:

bool floor_carry(struct chunk *c, struct loc grid, struct object *drop,
				 bool *note)
{
	int n = 0;
	struct object *obj, *ignore = floor_get_oldest_ignored(player, c, grid);

	/* Fail if the square can't hold objects */
	if (!square_isobjectholding(c, grid))
		return false;

	/* Scan objects in that grid for combination */
	for (obj = square_object(c, grid); obj; obj = obj->next) {
		/* Check for combination */
		if (object_mergeable(obj, drop, OSTACK_FLOOR)) {
			/* Combine the items */
			object_absorb(obj, drop);

			/* Note the pile */
			if (square_isview(c, grid)) {
				square_note_spot(c, grid);
			}

			/* Don't mention if ignored */
			if (ignore_item_ok(player, obj)) {
				*note = false;
			}

			/* Result */
			return true;
		}

		/* Count objects */
		n++;
	}

	/* The stack is already too large */
	if (n >= z_info->floor_size || (!OPT(player, birth_stacking) && n)) {
		/* Delete the oldest ignored object */
		if (ignore) {
			struct chunk *p_c = (c == cave) ? player->cave : NULL;
			square_excise_object(c, grid, ignore);
			delist_object(c, ignore);
			object_delete(c, p_c, &ignore);
		} else {
			return false;
		}
	}

	/* Location */
	drop->grid = grid;

	/* Forget monster */
	drop->held_m_idx = 0;

	/* Link to the first object in the pile */
	pile_insert(&c->squares[grid.y][grid.x].obj, drop);

	/* Record in the level list */
	list_object(c, drop);

	/* If there's a known version, put it in the player's view of the
	 * cave but at an unknown location.  square_note_spot() will move
	 * it to the correct place if seen. */
	if (drop->known) {
		drop->known->oidx = drop->oidx;
		drop->known->held_m_idx = 0;
		drop->known->grid = loc(0, 0);
		player->cave->objects[drop->oidx] = drop->known;
	}

	/* Redraw */
	square_note_spot(c, grid);
	square_light_spot(c, grid);

	/* Don't mention if ignored */
	if (ignore_item_ok(player, drop)) {
		*note = false;
	}

	/* Result */
	return true;
}